

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

int run_test_fs_readdir_non_empty_dir(void)

{
  char *__s1;
  int iVar1;
  undefined8 uVar2;
  uv_fs_t *unaff_RBX;
  uv_fs_t *puVar3;
  long lVar4;
  int64_t eval_b_3;
  int64_t eval_b_21;
  uv_fs_t rmdir_req;
  uv_fs_t close_req;
  uv_fs_t create_req;
  uv_fs_t mkdir_req;
  undefined1 auStack_910 [448];
  uv_fs_t *puStack_750;
  long local_740;
  long local_738;
  uv_fs_t *local_730 [56];
  undefined8 local_570 [56];
  undefined8 local_3b0 [11];
  uv_fs_t *local_358;
  undefined1 local_1f0 [448];
  
  puStack_750 = (uv_fs_t *)0x18bf2d;
  cleanup_test_files();
  puStack_750 = (uv_fs_t *)0x18bf32;
  uVar2 = uv_default_loop();
  puStack_750 = (uv_fs_t *)0x18bf51;
  iVar1 = uv_fs_mkdir(uVar2,local_1f0,"test_dir",0x1ed,0);
  local_730[0] = (uv_fs_t *)(long)iVar1;
  local_3b0[0] = 0;
  if (local_730[0] == (uv_fs_t *)0x0) {
    puStack_750 = (uv_fs_t *)0x18bf7c;
    uVar2 = uv_default_loop();
    puStack_750 = (uv_fs_t *)0x18bfa1;
    iVar1 = uv_fs_open(uVar2,local_3b0,"test_dir/file1",0x41,0x180,0);
    puVar3 = local_358;
    local_730[0] = (uv_fs_t *)(long)iVar1;
    local_570[0] = 0;
    if (local_730[0] != (uv_fs_t *)0x0) goto LAB_0018c588;
    local_730[0] = local_358;
    local_570[0] = 0;
    if ((long)local_358 < 0) goto LAB_0018c59a;
    puStack_750 = (uv_fs_t *)0x18c000;
    uv_fs_req_cleanup(local_3b0);
    puStack_750 = (uv_fs_t *)0x18c005;
    uVar2 = uv_default_loop();
    puStack_750 = (uv_fs_t *)0x18c019;
    iVar1 = uv_fs_close(uVar2,local_570,(ulong)puVar3 & 0xffffffff,0);
    local_730[0] = (uv_fs_t *)(long)iVar1;
    local_740 = 0;
    if (local_730[0] != (uv_fs_t *)0x0) goto LAB_0018c5ac;
    puStack_750 = (uv_fs_t *)0x18c046;
    uv_fs_req_cleanup(local_570);
    puStack_750 = (uv_fs_t *)0x18c04b;
    uVar2 = uv_default_loop();
    puStack_750 = (uv_fs_t *)0x18c070;
    iVar1 = uv_fs_open(uVar2,local_3b0,"test_dir/file2",0x41,0x180,0);
    local_730[0] = (uv_fs_t *)(long)iVar1;
    local_740 = 0;
    if (local_730[0] != (uv_fs_t *)0x0) goto LAB_0018c5bb;
    local_730[0] = local_358;
    local_740 = 0;
    puVar3 = local_358;
    if ((long)local_358 < 0) goto LAB_0018c5ca;
    puStack_750 = (uv_fs_t *)0x18c0c3;
    uv_fs_req_cleanup(local_3b0);
    puStack_750 = (uv_fs_t *)0x18c0c8;
    uVar2 = uv_default_loop();
    puStack_750 = (uv_fs_t *)0x18c0dc;
    iVar1 = uv_fs_close(uVar2,local_570,(ulong)local_358 & 0xffffffff,0);
    local_730[0] = (uv_fs_t *)(long)iVar1;
    local_740 = 0;
    if (local_730[0] != (uv_fs_t *)0x0) goto LAB_0018c5d9;
    puStack_750 = (uv_fs_t *)0x18c109;
    uv_fs_req_cleanup(local_570);
    puStack_750 = (uv_fs_t *)0x18c10e;
    uVar2 = uv_default_loop();
    puStack_750 = (uv_fs_t *)0x18c12d;
    iVar1 = uv_fs_mkdir(uVar2,local_1f0,"test_dir/test_subdir",0x1ed,0);
    local_730[0] = (uv_fs_t *)(long)iVar1;
    local_740 = 0;
    if (local_730[0] != (uv_fs_t *)0x0) goto LAB_0018c5e8;
    puStack_750 = (uv_fs_t *)0x18c15a;
    uv_fs_req_cleanup(local_1f0);
    puVar3 = &opendir_req;
    puStack_750 = (uv_fs_t *)0x18c173;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_750 = (uv_fs_t *)0x18c178;
    uVar2 = uv_default_loop();
    puStack_750 = (uv_fs_t *)0x18c18c;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",0);
    unaff_RBX = (uv_fs_t *)opendir_req.ptr;
    local_730[0] = (uv_fs_t *)(long)iVar1;
    local_740 = 0;
    if (local_730[0] != (uv_fs_t *)0x0) goto LAB_0018c5f7;
    local_730[0] = (uv_fs_t *)(long)opendir_req.fs_type;
    local_740 = 0x1f;
    if (local_730[0] != (uv_fs_t *)0x1f) goto LAB_0018c606;
    local_730[0] = (uv_fs_t *)opendir_req.result;
    local_740 = 0;
    if (opendir_req.result != 0) goto LAB_0018c615;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0018c624;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)unaff_RBX + 8) = 1;
    puStack_750 = (uv_fs_t *)0x18c224;
    uv_fs_req_cleanup(&opendir_req);
    puStack_750 = (uv_fs_t *)0x18c229;
    uVar2 = uv_default_loop();
    lVar4 = 0;
    puStack_750 = (uv_fs_t *)0x18c240;
    iVar1 = uv_fs_readdir(uVar2,&readdir_req,unaff_RBX,0);
    if (iVar1 != 0) {
      lVar4 = 0;
      do {
        __s1 = dirents[0].name;
        puStack_750 = (uv_fs_t *)0x18c272;
        iVar1 = strcmp(dirents[0].name,"file1");
        if (iVar1 != 0) {
          puStack_750 = (uv_fs_t *)0x18c285;
          iVar1 = strcmp(__s1,"file2");
          if (iVar1 == 0) goto LAB_0018c29c;
          puStack_750 = (uv_fs_t *)0x18c294;
          iVar1 = strcmp(__s1,"test_subdir");
          if (iVar1 == 0) goto LAB_0018c29c;
LAB_0018c562:
          puStack_750 = (uv_fs_t *)0x18c567;
          run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0018c567:
          puStack_750 = (uv_fs_t *)0x18c576;
          run_test_fs_readdir_non_empty_dir_cold_12();
          goto LAB_0018c576;
        }
LAB_0018c29c:
        puStack_750 = (uv_fs_t *)0x18c2a7;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) {
          local_730[0] = (uv_fs_t *)(ulong)dirents[0].type;
          local_740 = 2;
          if (local_730[0] == (uv_fs_t *)0x2) goto LAB_0018c2f4;
          goto LAB_0018c567;
        }
        local_730[0] = (uv_fs_t *)(ulong)dirents[0].type;
        local_740 = 1;
        if (local_730[0] != (uv_fs_t *)0x1) {
          puStack_750 = (uv_fs_t *)0x18c562;
          run_test_fs_readdir_non_empty_dir_cold_11();
          goto LAB_0018c562;
        }
LAB_0018c2f4:
        local_730[0] = (uv_fs_t *)(ulong)dirents[0].type;
        puStack_750 = (uv_fs_t *)0x18c2fc;
        uv_fs_req_cleanup(&readdir_req);
        lVar4 = lVar4 + 1;
        puStack_750 = (uv_fs_t *)0x18c304;
        uVar2 = uv_default_loop();
        puStack_750 = (uv_fs_t *)0x18c314;
        iVar1 = uv_fs_readdir(uVar2,&readdir_req,unaff_RBX,0);
      } while (iVar1 != 0);
    }
    local_730[0] = (uv_fs_t *)0x3;
    local_740 = lVar4;
    if (lVar4 != 3) goto LAB_0018c629;
    puStack_750 = (uv_fs_t *)0x18c346;
    uv_fs_req_cleanup(&readdir_req);
    puStack_750 = (uv_fs_t *)0x18c35f;
    memset(&closedir_req,0xdb,0x1c0);
    puStack_750 = (uv_fs_t *)0x18c364;
    uVar2 = uv_default_loop();
    puStack_750 = (uv_fs_t *)0x18c374;
    uv_fs_closedir(uVar2,&closedir_req,unaff_RBX,0);
    local_730[0] = (uv_fs_t *)closedir_req.result;
    local_740 = 0;
    if (closedir_req.result != 0) goto LAB_0018c638;
    puStack_750 = (uv_fs_t *)0x18c3a5;
    uv_fs_req_cleanup(&closedir_req);
    unaff_RBX = &opendir_req;
    puStack_750 = (uv_fs_t *)0x18c3be;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_750 = (uv_fs_t *)0x18c3c3;
    uVar2 = uv_default_loop();
    puStack_750 = (uv_fs_t *)0x18c3dc;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    local_730[0] = (uv_fs_t *)(long)iVar1;
    local_740 = 0;
    if (local_730[0] != (uv_fs_t *)0x0) goto LAB_0018c647;
    local_730[0] = (uv_fs_t *)(long)non_empty_opendir_cb_count;
    local_740 = 0;
    if (local_730[0] != (uv_fs_t *)0x0) goto LAB_0018c656;
    local_730[0] = (uv_fs_t *)(long)non_empty_closedir_cb_count;
    local_740 = 0;
    if (local_730[0] != (uv_fs_t *)0x0) goto LAB_0018c665;
    puStack_750 = (uv_fs_t *)0x18c44b;
    uVar2 = uv_default_loop();
    puStack_750 = (uv_fs_t *)0x18c455;
    iVar1 = uv_run(uVar2,0);
    local_730[0] = (uv_fs_t *)(long)iVar1;
    local_740 = 0;
    if (local_730[0] != (uv_fs_t *)0x0) goto LAB_0018c674;
    local_730[0] = (uv_fs_t *)0x1;
    local_740 = (long)non_empty_opendir_cb_count;
    if (local_740 != 1) goto LAB_0018c683;
    local_730[0] = (uv_fs_t *)0x1;
    local_740 = (long)non_empty_closedir_cb_count;
    if (local_740 == 1) {
      puStack_750 = (uv_fs_t *)0x18c4c4;
      uVar2 = uv_default_loop();
      puStack_750 = (uv_fs_t *)0x18c4dd;
      uv_fs_rmdir(uVar2,local_730,"test_subdir",0);
      puStack_750 = (uv_fs_t *)0x18c4e5;
      uv_fs_req_cleanup(local_730);
      puStack_750 = (uv_fs_t *)0x18c4ea;
      cleanup_test_files();
      puStack_750 = (uv_fs_t *)0x18c4ef;
      unaff_RBX = (uv_fs_t *)uv_default_loop();
      puStack_750 = (uv_fs_t *)0x18c503;
      uv_walk(unaff_RBX,close_walk_cb,0);
      puStack_750 = (uv_fs_t *)0x18c50d;
      uv_run(unaff_RBX,0);
      local_740 = 0;
      puStack_750 = (uv_fs_t *)0x18c51b;
      uVar2 = uv_default_loop();
      puStack_750 = (uv_fs_t *)0x18c523;
      iVar1 = uv_loop_close(uVar2);
      local_738 = (long)iVar1;
      if (local_740 == local_738) {
        puStack_750 = (uv_fs_t *)0x18c53f;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018c6a1;
    }
  }
  else {
LAB_0018c576:
    puStack_750 = (uv_fs_t *)0x18c588;
    run_test_fs_readdir_non_empty_dir_cold_1();
LAB_0018c588:
    puVar3 = unaff_RBX;
    puStack_750 = (uv_fs_t *)0x18c59a;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0018c59a:
    puStack_750 = (uv_fs_t *)0x18c5ac;
    run_test_fs_readdir_non_empty_dir_cold_24();
LAB_0018c5ac:
    puStack_750 = (uv_fs_t *)0x18c5bb;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0018c5bb:
    puStack_750 = (uv_fs_t *)0x18c5ca;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0018c5ca:
    puStack_750 = (uv_fs_t *)0x18c5d9;
    run_test_fs_readdir_non_empty_dir_cold_23();
LAB_0018c5d9:
    puStack_750 = (uv_fs_t *)0x18c5e8;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0018c5e8:
    puStack_750 = (uv_fs_t *)0x18c5f7;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0018c5f7:
    puStack_750 = (uv_fs_t *)0x18c606;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0018c606:
    puStack_750 = (uv_fs_t *)0x18c615;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0018c615:
    unaff_RBX = puVar3;
    puStack_750 = (uv_fs_t *)0x18c624;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0018c624:
    puStack_750 = (uv_fs_t *)0x18c629;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0018c629:
    puStack_750 = (uv_fs_t *)0x18c638;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0018c638:
    puStack_750 = (uv_fs_t *)0x18c647;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0018c647:
    puStack_750 = (uv_fs_t *)0x18c656;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0018c656:
    puStack_750 = (uv_fs_t *)0x18c665;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0018c665:
    puStack_750 = (uv_fs_t *)0x18c674;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0018c674:
    puStack_750 = (uv_fs_t *)0x18c683;
    run_test_fs_readdir_non_empty_dir_cold_18();
LAB_0018c683:
    puStack_750 = (uv_fs_t *)0x18c692;
    run_test_fs_readdir_non_empty_dir_cold_19();
  }
  puStack_750 = (uv_fs_t *)0x18c6a1;
  run_test_fs_readdir_non_empty_dir_cold_20();
LAB_0018c6a1:
  puStack_750 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_21();
  puStack_750 = unaff_RBX;
  uv_fs_unlink(0,auStack_910,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_910);
  uv_fs_unlink(0,auStack_910,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_910);
  uv_fs_rmdir(0,auStack_910,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_910);
  uv_fs_rmdir(0,auStack_910,"test_dir",0);
  iVar1 = uv_fs_req_cleanup(auStack_910);
  return iVar1;
}

Assistant:

TEST_IMPL(fs_readdir_non_empty_dir) {
  size_t entries_count;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  uv_fs_t create_req;
  uv_fs_t close_req;
  uv_dir_t* dir;
  uv_os_fd_t file;
  int r;

  cleanup_test_files();

  r = uv_fs_mkdir(uv_default_loop(), &mkdir_req, "test_dir", 0755, NULL);
  ASSERT_OK(r);

  /* Create two files synchronously. */
  r = uv_fs_open(uv_default_loop(),
                 &create_req,
                 "test_dir/file1",
                 UV_FS_O_WRONLY | UV_FS_O_CREAT, S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT_OK(r);
  ASSERT_GE(create_req.result, 0);
  file = (uv_os_fd_t) create_req.result;
  uv_fs_req_cleanup(&create_req);
  r = uv_fs_close(uv_default_loop(), &close_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(uv_default_loop(),
                 &create_req,
                 "test_dir/file2",
                 UV_FS_O_WRONLY | UV_FS_O_CREAT, S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT_OK(r);
  ASSERT_GE(create_req.result, 0);
  file = (uv_os_fd_t) create_req.result;
  uv_fs_req_cleanup(&create_req);
  r = uv_fs_close(uv_default_loop(), &close_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_mkdir(uv_default_loop(),
                  &mkdir_req,
                  "test_dir/test_subdir",
                  0755,
                  NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&mkdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, "test_dir", NULL);
  ASSERT_OK(r);
  ASSERT_EQ(opendir_req.fs_type, UV_FS_OPENDIR);
  ASSERT_OK(opendir_req.result);
  ASSERT_NOT_NULL(opendir_req.ptr);

  entries_count = 0;
  dir = opendir_req.ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  uv_fs_req_cleanup(&opendir_req);

  while (uv_fs_readdir(uv_default_loop(),
                       &readdir_req,
                       dir,
                       NULL) != 0) {
  ASSERT(strcmp(dirents[0].name, "file1") == 0 ||
         strcmp(dirents[0].name, "file2") == 0 ||
         strcmp(dirents[0].name, "test_subdir") == 0);
#ifdef HAVE_DIRENT_TYPES
    if (!strcmp(dirents[0].name, "test_subdir"))
      ASSERT_EQ(dirents[0].type, UV_DIRENT_DIR);
    else
      ASSERT_EQ(dirents[0].type, UV_DIRENT_FILE);
#else
    ASSERT_EQ(dirents[0].type, UV_DIRENT_UNKNOWN);
#endif /* HAVE_DIRENT_TYPES */
    uv_fs_req_cleanup(&readdir_req);
    ++entries_count;
  }

  ASSERT_EQ(3, entries_count);
  uv_fs_req_cleanup(&readdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&closedir_req, 0xdb, sizeof(closedir_req));
  uv_fs_closedir(uv_default_loop(), &closedir_req, dir, NULL);
  ASSERT_OK(closedir_req.result);
  uv_fs_req_cleanup(&closedir_req);

  /* Testing the asynchronous flavor. */

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    "test_dir",
                    non_empty_opendir_cb);
  ASSERT_OK(r);
  ASSERT_OK(non_empty_opendir_cb_count);
  ASSERT_OK(non_empty_closedir_cb_count);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(1, non_empty_opendir_cb_count);
  ASSERT_EQ(1, non_empty_closedir_cb_count);

  uv_fs_rmdir(uv_default_loop(), &rmdir_req, "test_subdir", NULL);
  uv_fs_req_cleanup(&rmdir_req);

  cleanup_test_files();
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
 }